

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::BufferSizeCase::testBuffer(BufferSizeCase *this)

{
  BufferParamVerifier *pBVar1;
  uint uVar2;
  int local_38;
  GLint len;
  int i;
  undefined1 local_24 [8];
  Random rnd;
  int numIteration;
  BufferSizeCase *this_local;
  
  rnd.m_rnd.z = 0x10;
  unique0x1000024d = this;
  de::Random::Random((Random *)local_24,0xabcdef);
  pBVar1 = (this->super_BufferCase).m_verifier;
  (*pBVar1->_vptr_BufferParamVerifier[2])
            (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x8764,0
            );
  for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
    uVar2 = de::Random::getInt((Random *)local_24,0,0x400);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferCase).super_ApiCase.super_CallLogWrapper,
               (this->super_BufferCase).m_bufferTarget,(long)(int)uVar2,(void *)0x0,0x88e0);
    ApiCase::expectError((ApiCase *)this,0);
    pBVar1 = (this->super_BufferCase).m_verifier;
    (*pBVar1->_vptr_BufferParamVerifier[2])
              (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x8764
               ,(ulong)uVar2);
    ApiCase::expectError((ApiCase *)this,0);
  }
  de::Random::~Random((Random *)local_24);
  return;
}

Assistant:

void testBuffer (void)
	{
		const int numIteration = 16;
		de::Random rnd(0xabcdef);

		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_SIZE, 0);

		for (int i = 0; i < numIteration; ++i)
		{
			const GLint len = rnd.getInt(0, 1024);
			glBufferData(m_bufferTarget, len, DE_NULL, GL_STREAM_DRAW);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_SIZE, len);
			expectError(GL_NO_ERROR);
		}
	}